

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture1DArrayGrad(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  int i;
  long lVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  Texture1DArrayView local_20;
  
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  fVar3 = (float)(c->textures[0].tex1DArray)->m_width;
  fVar4 = c->in[1].m_data[0] * fVar3;
  fVar3 = fVar3 * c->in[2].m_data[0];
  uVar2 = -(uint)(-fVar4 <= fVar4);
  fVar4 = (float)(~uVar2 & (uint)-fVar4 | (uint)fVar4 & uVar2);
  uVar2 = -(uint)(-fVar3 <= fVar3);
  fVar3 = (float)(~uVar2 & (uint)-fVar3 | (uint)fVar3 & uVar2);
  uVar2 = -(uint)(fVar3 <= fVar4);
  fVar3 = logf((float)(~uVar2 & (uint)fVar3 | uVar2 & (uint)fVar4));
  tcu::Texture1DArrayView::sample
            (&local_20,(Sampler *)&(c->textures[0].tex1DArray)->m_view,s,t,fVar3 * 1.442695);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar1 = 0;
  do {
    local_48[lVar1] = (float)(&local_20.m_numLevels)[lVar1] * (p->scale).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_38 + lVar1 * 4) = local_48[lVar1] + (p->bias).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void		evalTexture1DArrayGrad		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture1DArray(c, c.in[0].x(), c.in[0].y(), computeLodFromGrad1DArray(c))*p.scale + p.bias; }